

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufGetAllocationScheme(xmlBufPtr buf)

{
  xmlBufPtr buf_local;
  
  if (buf == (xmlBufPtr)0x0) {
    buf_local._4_4_ = ~XML_BUFFER_ALLOC_DOUBLEIT;
  }
  else {
    buf_local._4_4_ = buf->alloc;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufGetAllocationScheme(xmlBufPtr buf) {
    if (buf == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufGetAllocationScheme: buf == NULL\n");
#endif
        return(-1);
    }
    return(buf->alloc);
}